

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

String * __thiscall
Diligent::HLSL2GLSLConverterImpl::Convert_abi_cxx11_
          (String *__return_storage_ptr__,HLSL2GLSLConverterImpl *this,ConversionAttribs *Attribs)

{
  undefined *puVar1;
  bool bVar2;
  undefined8 uVar3;
  char (*in_stack_fffffffffffffe78) [30];
  undefined1 local_150 [8];
  string _msg;
  String *FileNameFromStream;
  ConversionStream *pStream;
  runtime_error *anon_var_0;
  undefined1 local_100 [8];
  ConversionStream Stream;
  ConversionAttribs *Attribs_local;
  HLSL2GLSLConverterImpl *this_local;
  
  Stream.m_InputFileName.field_2._8_8_ = Attribs;
  if (Attribs->ppConversionStream == (IHLSL2GLSLConversionStream **)0x0) {
    ConversionStream::ConversionStream
              ((ConversionStream *)local_100,(IReferenceCounters *)0x0,this,Attribs->InputFileName,
               Attribs->pSourceStreamFactory,Attribs->HLSLSource,Attribs->NumSymbols,false);
    ConversionStream::Convert_abi_cxx11_
              (__return_storage_ptr__,(ConversionStream *)local_100,
               *(Char **)(Stream.m_InputFileName.field_2._8_8_ + 0x20),
               *(SHADER_TYPE *)(Stream.m_InputFileName.field_2._8_8_ + 0x28),
               (bool)(*(byte *)(Stream.m_InputFileName.field_2._8_8_ + 0x2c) & 1),
               *(char **)(Stream.m_InputFileName.field_2._8_8_ + 0x38),
               (bool)(*(byte *)(Stream.m_InputFileName.field_2._8_8_ + 0x40) & 1),
               (bool)(*(byte *)(Stream.m_InputFileName.field_2._8_8_ + 0x41) & 1));
    ConversionStream::~ConversionStream((ConversionStream *)local_100);
  }
  else {
    FileNameFromStream = (String *)0x0;
    if (*Attribs->ppConversionStream != (IHLSL2GLSLConversionStream *)0x0) {
      FileNameFromStream =
           (String *)
           ClassPtrCast<Diligent::HLSL2GLSLConverterImpl::ConversionStream,Diligent::IHLSL2GLSLConversionStream>
                     (*Attribs->ppConversionStream);
      _msg.field_2._8_8_ =
           ConversionStream::GetInputFileName_abi_cxx11_((ConversionStream *)FileNameFromStream);
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              _msg.field_2._8_8_,
                              *(char **)(Stream.m_InputFileName.field_2._8_8_ + 0x30));
      if (bVar2) {
        FormatString<char[46],std::__cxx11::string,char[61],char_const*,char[30]>
                  ((string *)local_150,(Diligent *)"Input stream was initialized for input file \"",
                   (char (*) [46])_msg.field_2._8_8_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "\" that does not match the name of the file to be converted \"",
                   (char (*) [61])(Stream.m_InputFileName.field_2._8_8_ + 0x30),
                   (char **)"\". New stream will be created",in_stack_fffffffffffffe78);
        puVar1 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar3 = std::__cxx11::string::c_str();
          (*(code *)puVar1)(1,uVar3,0);
        }
        std::__cxx11::string::~string((string *)local_150);
        (**(code **)(*(long *)**(undefined8 **)(Stream.m_InputFileName.field_2._8_8_ + 8) + 0x10))()
        ;
        **(undefined8 **)(Stream.m_InputFileName.field_2._8_8_ + 8) = 0;
      }
    }
    if (**(long **)(Stream.m_InputFileName.field_2._8_8_ + 8) == 0) {
      CreateStream(this,*(Char **)(Stream.m_InputFileName.field_2._8_8_ + 0x30),
                   *(IShaderSourceInputStreamFactory **)Stream.m_InputFileName.field_2._8_8_,
                   *(Char **)(Stream.m_InputFileName.field_2._8_8_ + 0x10),
                   *(size_t *)(Stream.m_InputFileName.field_2._8_8_ + 0x18),
                   *(IHLSL2GLSLConversionStream ***)(Stream.m_InputFileName.field_2._8_8_ + 8));
      FileNameFromStream =
           (String *)
           ClassPtrCast<Diligent::HLSL2GLSLConverterImpl::ConversionStream,Diligent::IHLSL2GLSLConversionStream>
                     ((IHLSL2GLSLConversionStream *)
                      **(undefined8 **)(Stream.m_InputFileName.field_2._8_8_ + 8));
    }
    ConversionStream::Convert_abi_cxx11_
              (__return_storage_ptr__,(ConversionStream *)FileNameFromStream,
               *(Char **)(Stream.m_InputFileName.field_2._8_8_ + 0x20),
               *(SHADER_TYPE *)(Stream.m_InputFileName.field_2._8_8_ + 0x28),
               (bool)(*(byte *)(Stream.m_InputFileName.field_2._8_8_ + 0x2c) & 1),
               *(char **)(Stream.m_InputFileName.field_2._8_8_ + 0x38),
               (bool)(*(byte *)(Stream.m_InputFileName.field_2._8_8_ + 0x40) & 1),
               (bool)(*(byte *)(Stream.m_InputFileName.field_2._8_8_ + 0x41) & 1));
  }
  return __return_storage_ptr__;
}

Assistant:

String HLSL2GLSLConverterImpl::Convert(ConversionAttribs& Attribs) const
{
    if (Attribs.ppConversionStream == nullptr)
    {
        try
        {
            ConversionStream Stream(nullptr, *this, Attribs.InputFileName, Attribs.pSourceStreamFactory, Attribs.HLSLSource, Attribs.NumSymbols, false);
            return Stream.Convert(Attribs.EntryPoint, Attribs.ShaderType, Attribs.IncludeDefinitions,
                                  Attribs.SamplerSuffix, Attribs.UseInOutLocationQualifiers,
                                  Attribs.UseRowMajorMatrices);
        }
        catch (std::runtime_error&)
        {
            return "";
        }
    }
    else
    {
        ConversionStream* pStream = nullptr;
        if (*Attribs.ppConversionStream != nullptr)
        {
            pStream = ClassPtrCast<ConversionStream>(*Attribs.ppConversionStream);

            const auto& FileNameFromStream = pStream->GetInputFileName();
            if (FileNameFromStream != Attribs.InputFileName)
            {
                LOG_WARNING_MESSAGE("Input stream was initialized for input file \"", FileNameFromStream, "\" that does not match the name of the file to be converted \"", Attribs.InputFileName, "\". New stream will be created");
                (*Attribs.ppConversionStream)->Release();
                *Attribs.ppConversionStream = nullptr;
            }
        }

        if (*Attribs.ppConversionStream == nullptr)
        {
            CreateStream(Attribs.InputFileName, Attribs.pSourceStreamFactory, Attribs.HLSLSource, Attribs.NumSymbols, Attribs.ppConversionStream);
            pStream = ClassPtrCast<ConversionStream>(*Attribs.ppConversionStream);
        }

        return pStream->Convert(Attribs.EntryPoint, Attribs.ShaderType, Attribs.IncludeDefinitions,
                                Attribs.SamplerSuffix, Attribs.UseInOutLocationQualifiers,
                                Attribs.UseRowMajorMatrices);
    }
}